

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Precipitation> metaf::Precipitation::fromRainfallString(string *s)

{
  bool bVar1;
  optional<unsigned_int> oVar2;
  optional<unsigned_int> oVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  optional<metaf::Precipitation> oVar7;
  
  bVar1 = std::operator==(s,"///./");
  if (bVar1) {
LAB_00191c06:
    uVar6 = 0x100000000;
  }
  else {
    bVar1 = std::operator==(s,"//./");
    if (bVar1) goto LAB_00191c06;
    uVar4 = s->_M_string_length;
    if (((uVar4 & 0xfffffffffffffffe) == 4) && ((s->_M_dataplus)._M_p[uVar4 - 2] == '.')) {
      oVar2 = strToUint(s,uVar4 - 1,1);
      if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
        oVar3 = strToUint(s,0,s->_M_string_length - 2);
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0;
        if (((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
          uVar4 = (ulong)(uint)(float)((double)((ulong)oVar2.
                                                  super__Optional_base<unsigned_int,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<unsigned_int> &
                                               0xffffffff) * 0.1 +
                                      (double)((ulong)oVar3.
                                                  super__Optional_base<unsigned_int,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<unsigned_int> &
                                              0xffffffff));
          uVar5 = 0x100000000;
          uVar6 = 0x100000000;
        }
        goto LAB_00191c42;
      }
    }
    uVar6 = 0;
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_00191c42:
  oVar7.super__Optional_base<metaf::Precipitation,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Precipitation>._M_payload._0_8_ = uVar4 | uVar5;
  oVar7.super__Optional_base<metaf::Precipitation,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Precipitation>._8_8_ = uVar6;
  return (optional<metaf::Precipitation>)
         oVar7.super__Optional_base<metaf::Precipitation,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Precipitation>;
}

Assistant:

std::optional<Precipitation> Precipitation::fromRainfallString(const std::string & s) {
	//static const std::regex rgx("\\d?\\d\\d\\.\\d");
	static const std::optional<Precipitation> error;
	if (s == "///./" || s == "//./") return Precipitation();
	if (s.length() != 4 && s.length() != 5) return error;
	if (s[s.length()-2] != '.') return error;
	const auto fractPart = strToUint(s, s.length() - 1, 1);
	if (!fractPart.has_value()) return error;
	const auto intPart = strToUint(s, 0, s.length() - 2);
	if (!intPart.has_value()) return error;
	Precipitation precipitation;
	precipitation.precipValue = *intPart + 0.1 * *fractPart;
	return precipitation;
}